

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::IsFltBuiltInConst(PropertyId propertyId)

{
  if (propertyId < 0xd3) {
    if (((uint)propertyId < 0x2c) && ((0xb0000000000U >> ((ulong)(uint)propertyId & 0x3f) & 1) != 0)
       ) {
      return true;
    }
    if (propertyId == 0x75) {
      return true;
    }
  }
  else {
    if (propertyId - 0xd3U < 2) {
      return true;
    }
    if (propertyId - 0x157U < 2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool JavascriptLibrary::IsFltBuiltInConst(PropertyId propertyId)
    {
        switch (propertyId)
        {
        case Js::PropertyIds::E:
        case Js::PropertyIds::LN10:
        case Js::PropertyIds::LN2:
        case Js::PropertyIds::LOG2E:
        case Js::PropertyIds::LOG10E:
        case Js::PropertyIds::PI:
        case Js::PropertyIds::SQRT1_2:
        case Js::PropertyIds::SQRT2:
            return true;
        }
        return false;
    }